

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

void __thiscall Lodtalk::VMHeap::initialize(VMHeap *this)

{
  size_t sVar1;
  uint8_t *puVar2;
  
  sVar1 = getPageSize();
  this->pageSize = sVar1;
  this->maxCapacity = 0x400000000;
  this->capacity = 0;
  this->size = 0;
  puVar2 = reserveVirtualAddressSpace(0x400000000);
  this->addressSpace = puVar2;
  if (puVar2 != (uint8_t *)0x0) {
    return;
  }
  fwrite("Failed to reserve the VM heap memory address space.\n",0x34,1,_stderr);
  abort();
}

Assistant:

void VMHeap::initialize()
{
    // Get the page size.
    pageSize = getPageSize();

    // Allocate the virtual address space.
    maxCapacity = DefaultMaxVMHeapSize;
    capacity = 0;
    size = 0;
    addressSpace = reserveVirtualAddressSpace(maxCapacity);
    if(!addressSpace)
    {
        fprintf(stderr, "Failed to reserve the VM heap memory address space.\n");
        abort();
    }
}